

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomposition.hpp
# Opt level: O0

void diy::decompose<diy::Bounds<int>>
               (int dim,int rank,Bounds<int> *domain,StaticAssigner *assigner,Creator *create,
               BoolVector *share_face,BoolVector *wrap,CoordinateVector *ghosts,
               DivisionsVector *divs)

{
  Assigner *in_RCX;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  Creator *in_stack_00000748;
  StaticAssigner *in_stack_00000750;
  int in_stack_0000075c;
  RegularDecomposer<diy::Bounds<int>_> *in_stack_00000760;
  RegularDecomposer<diy::Bounds<int>_> *this;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe38;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe40;
  BoolVector *in_stack_fffffffffffffe48;
  BoolVector *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe5c;
  Bounds *in_stack_fffffffffffffe60;
  type in_stack_fffffffffffffe6c;
  RegularDecomposer<diy::Bounds<int>_> *in_stack_fffffffffffffe70;
  CoordinateVector *in_stack_fffffffffffffe80;
  DivisionsVector *in_stack_fffffffffffffe88;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffea8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffeb0;
  
  Assigner::nblocks(in_RCX);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  this = (RegularDecomposer<diy::Bounds<int>_> *)&stack0xfffffffffffffe38;
  RegularDecomposer<diy::Bounds<int>_>::RegularDecomposer
            (in_stack_fffffffffffffe70,(int)in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
             in_stack_fffffffffffffe5c,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe80,in_stack_fffffffffffffe88);
  RegularDecomposer<diy::Bounds<int>_>::decompose
            (in_stack_00000760,in_stack_0000075c,in_stack_00000750,in_stack_00000748);
  RegularDecomposer<diy::Bounds<int>_>::~RegularDecomposer(this);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_00000018);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_00000018);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10c7a6)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x10c7b3)
  ;
  return;
}

Assistant:

void decompose(int                    dim,
                 int                    rank,
                 const Bounds&          domain,
                 const StaticAssigner&  assigner,
                 const typename RegularDecomposer<Bounds>::Creator&   create,
                 typename RegularDecomposer<Bounds>::BoolVector       share_face = typename RegularDecomposer<Bounds>::BoolVector(),
                 typename RegularDecomposer<Bounds>::BoolVector       wrap       = typename RegularDecomposer<Bounds>::BoolVector(),
                 typename RegularDecomposer<Bounds>::CoordinateVector ghosts     = typename RegularDecomposer<Bounds>::CoordinateVector(),
                 typename RegularDecomposer<Bounds>::DivisionsVector  divs       = typename RegularDecomposer<Bounds>::DivisionsVector())
  {
    RegularDecomposer<Bounds>(dim, domain, assigner.nblocks(), share_face, wrap, ghosts, divs).decompose(rank, assigner, create);
  }